

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::GenerateInterfaceProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *target,ostream *os,
          ImportPropertyMap *properties)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string targetName;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  if ((properties->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_90.View_._M_str = (this->Namespace)._M_dataplus._M_p;
    local_90.View_._M_len = (this->Namespace)._M_string_length;
    cmGeneratorTarget::GetExportName_abi_cxx11_(&local_b0,target);
    local_60.View_._M_len = local_b0._M_string_length;
    local_60.View_._M_str = local_b0._M_dataplus._M_p;
    cmStrCat<>(&local_d0,&local_90,&local_60);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar1 = std::operator<<(os,"set_target_properties(");
    poVar1 = std::operator<<(poVar1,(string *)&local_d0);
    std::operator<<(poVar1," PROPERTIES\n");
    for (p_Var2 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(properties->_M_t)._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      poVar1 = std::operator<<(os,"  ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
      poVar1 = std::operator<<(poVar1," ");
      cmExportFileGeneratorEscape((string *)&local_90,(string *)(p_Var2 + 2));
      poVar1 = std::operator<<(poVar1,(string *)&local_90);
      std::operator<<(poVar1,"\n");
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::operator<<(os,")\n\n");
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType targetType)
{
  // Construct the imported target name.
  std::string targetName = this->Namespace;

  targetName += target->GetExportName();

  // Create the imported target.
  os << "# Create imported target " << targetName << "\n";
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      os << "add_executable(" << targetName << " IMPORTED)\n";
      break;
    case cmStateEnums::STATIC_LIBRARY:
      os << "add_library(" << targetName << " STATIC IMPORTED)\n";
      break;
    case cmStateEnums::SHARED_LIBRARY:
      os << "add_library(" << targetName << " SHARED IMPORTED)\n";
      break;
    case cmStateEnums::MODULE_LIBRARY:
      os << "add_library(" << targetName << " MODULE IMPORTED)\n";
      break;
    case cmStateEnums::UNKNOWN_LIBRARY:
      os << "add_library(" << targetName << " UNKNOWN IMPORTED)\n";
      break;
    case cmStateEnums::OBJECT_LIBRARY:
      os << "add_library(" << targetName << " OBJECT IMPORTED)\n";
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      os << "add_library(" << targetName << " INTERFACE IMPORTED)\n";
      break;
    default: // should never happen
      break;
  }

  // Mark the imported executable if it has exports.
  if (target->IsExecutableWithExports()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY ENABLE_EXPORTS 1)\n";
  }

  // Mark the imported library if it is a framework.
  if (target->IsFrameworkOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY FRAMEWORK 1)\n";
  }

  // Mark the imported executable if it is an application bundle.
  if (target->IsAppBundleOnApple()) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY MACOSX_BUNDLE 1)\n";
  }

  if (target->IsCFBundleOnApple()) {
    os << "set_property(TARGET " << targetName << " PROPERTY BUNDLE 1)\n";
  }

  // generate DEPRECATION
  if (target->IsDeprecated()) {
    os << "set_property(TARGET " << targetName << " PROPERTY DEPRECATION "
       << cmExportFileGeneratorEscape(target->GetDeprecation()) << ")\n";
  }

  if (target->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName
       << " PROPERTY IMPORTED_NO_SYSTEM 1)\n";
  }

  if (target->GetPropertyAsBool("EXPORT_NO_SYSTEM")) {
    os << "set_property(TARGET " << targetName << " PROPERTY SYSTEM 0)\n";
  }

  os << "\n";
}